

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

void CGL::Collada::ColladaParser::parse_sphere(XMLElement *xml,SphereInfo *sphere)

{
  char *pcVar1;
  XMLElement *pXVar2;
  char *pcVar3;
  double dVar4;
  string local_48;
  
  pcVar1 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  pcVar3 = (char *)(sphere->super_Instance).id._M_string_length;
  strlen(pcVar1);
  std::__cxx11::string::_M_replace((ulong)&(sphere->super_Instance).id,0,pcVar3,(ulong)pcVar1);
  pcVar1 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  pcVar3 = (char *)(sphere->super_Instance).name._M_string_length;
  strlen(pcVar1);
  std::__cxx11::string::_M_replace((ulong)&(sphere->super_Instance).name,0,pcVar3,(ulong)pcVar1);
  (sphere->super_Instance).type = SPHERE;
  pXVar2 = get_technique_CGL(xml);
  if (pXVar2 != (XMLElement *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"sphere/radius","");
    pXVar2 = get_element(pXVar2,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (pXVar2 != (XMLElement *)0x0) {
      pcVar3 = tinyxml2::XMLElement::GetText(pXVar2);
      dVar4 = atof(pcVar3);
      sphere->radius = (float)dVar4;
      return;
    }
  }
  exit(1);
}

Assistant:

void ColladaParser::parse_sphere(XMLElement* xml, SphereInfo& sphere) {

  // name & id
  sphere.id   = xml->Attribute( "id" );
  sphere.name = xml->Attribute("name");
  sphere.type = Instance::SPHERE;

  XMLElement* e_technique = get_technique_CGL(xml);
  if (!e_technique) {
    stat("Error: no 462 profile technique in geometry: " << sphere.id);
    exit(EXIT_FAILURE);
  }

  XMLElement* e_radius = get_element(e_technique, "sphere/radius");
  if (!e_radius) {
    stat("Error: invalid sphere definition in geometry: " << sphere.id);
    exit(EXIT_FAILURE);
  }

  sphere.radius = atof(e_radius->GetText());

  // print summary
  stat("  |- " << sphere);
}